

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O0

double * __thiscall L15_4::Sales::operator[](Sales *this,int i)

{
  int ix;
  BadIndex *this_00;
  allocator local_39;
  string local_38;
  int local_14;
  Sales *pSStack_10;
  int i_local;
  Sales *this_local;
  
  if ((-1 < i) && (i < 0xd)) {
    return this->_gross + i;
  }
  local_14 = i;
  pSStack_10 = this;
  this_00 = (BadIndex *)__cxa_allocate_exception(0x18);
  ix = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Index Error in Sales Object\n",&local_39);
  BadIndex::BadIndex(this_00,ix,&local_38);
  __cxa_throw(this_00,&BadIndex::typeinfo,BadIndex::~BadIndex);
}

Assistant:

double & Sales::operator[](int i) {
        if (i < 0 || i > MONTHS) {
            throw BadIndex(i);
        }
        return _gross[i];
    }